

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

void __thiscall QGestureManager::~QGestureManager(QGestureManager *this)

{
  long lVar1;
  bool bVar2;
  QGestureRecognizer **ppQVar3;
  QObject *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  const_iterator *in_stack_ffffffffffffffc0;
  QObject *this_00;
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00d073c0;
  this_00 = in_RDI;
  qDeleteAll<QMultiMap<Qt::GestureType,QGestureRecognizer*>>
            ((QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *)in_stack_ffffffffffffffc0);
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::cbegin(in_stack_ffffffffffffffd8);
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::cend
            ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)in_RDI);
  while( true ) {
    bVar2 = QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::const_iterator::operator!=
                      ((const_iterator *)in_RDI,in_stack_ffffffffffffffc0);
    if (!bVar2) break;
    QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::const_iterator::value
              ((const_iterator *)0x30568b);
    qDeleteAll<QSet<QGesture*>>((QSet<QGesture_*> *)in_RDI);
    ppQVar3 = QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::const_iterator::key
                        ((const_iterator *)0x30569d);
    in_stack_ffffffffffffffc0 = (const_iterator *)*ppQVar3;
    if (in_stack_ffffffffffffffc0 != (const_iterator *)0x0) {
      (*(code *)((in_stack_ffffffffffffffc0->i).d)->size)();
    }
    QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::const_iterator::operator++
              ((const_iterator *)this_00);
  }
  QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x3056d2);
  QHash<QGesture_*,_QGestureRecognizer_*>::~QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)in_stack_ffffffffffffffc0);
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::~QHash
            ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)in_stack_ffffffffffffffc0);
  QHash<QGesture_*,_QPointer<QWidget>_>::~QHash
            ((QHash<QGesture_*,_QPointer<QWidget>_> *)in_stack_ffffffffffffffc0);
  QHash<QGesture_*,_QObject_*>::~QHash((QHash<QGesture_*,_QObject_*> *)in_stack_ffffffffffffffc0);
  QHash<QGesture_*,_QGestureRecognizer_*>::~QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)in_stack_ffffffffffffffc0);
  QMap<QGestureManager::ObjectGesture,_QList<QGesture_*>_>::~QMap
            ((QMap<QGestureManager::ObjectGesture,_QList<QGesture_*>_> *)0x305726);
  QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x305734);
  QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x305742);
  QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::~QMultiMap
            ((QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *)0x305750);
  QObject::~QObject(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGestureManager::~QGestureManager()
{
    qDeleteAll(m_recognizers);
    for (auto it = m_obsoleteGestures.cbegin(), end = m_obsoleteGestures.cend(); it != end; ++it) {
        qDeleteAll(it.value());
        delete it.key();
    }
}